

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * decDecap(decNumber *dn,int32_t drop)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  
  puVar1 = dn->lsu;
  uVar2 = dn->digits - drop;
  if (uVar2 == 0 || dn->digits < drop) {
    *puVar1 = '\0';
    iVar3 = 1;
  }
  else {
    if ((int)uVar2 < 0x32) {
      uVar4 = (ulong)""[(int)uVar2];
      uVar6 = (uint)""[(int)uVar2];
    }
    else {
      uVar4 = (ulong)uVar2;
      uVar6 = uVar2;
    }
    puVar5 = puVar1 + (uVar4 - 1);
    iVar3 = (uVar2 - uVar6) + 1;
    if (iVar3 != 1) {
      *puVar5 = (byte)((uint)*puVar5 % DECPOWERS[iVar3]);
    }
    iVar3 = ((int)puVar5 - (int)puVar1) + 1;
    puVar5 = puVar1 + iVar3;
    for (; ((puVar5 = puVar5 + -1, puVar1 <= puVar5 && (*puVar5 == '\0')) && (iVar3 != 1));
        iVar3 = iVar3 + -1) {
    }
  }
  dn->digits = iVar3;
  return dn;
}

Assistant:

static decNumber *decDecap(decNumber *dn, Int drop) {
  Unit *msu;                            /* -> target cut point  */
  Int cut;                              /* work  */
  if (drop>=dn->digits) {               /* losing the whole thing  */
    #if DECCHECK
    if (drop>dn->digits)
      printf("decDecap called with drop>digits [%ld>%ld]\n",
             (LI)drop, (LI)dn->digits);
    #endif
    dn->lsu[0]=0;
    dn->digits=1;
    return dn;
    }
  msu=dn->lsu+D2U(dn->digits-drop)-1;   /* -> likely msu  */
  cut=MSUDIGITS(dn->digits-drop);       /* digits to be in use in msu  */
  if (cut!=DECDPUN) *msu%=powers[cut];  /* clear left digits  */
  /* that may have left leading zero digits, so do a proper count...  */
  dn->digits=decGetDigits(dn->lsu, static_cast<int32_t>(msu-dn->lsu+1));
  return dn;
  }